

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

int cf_string_cmp_raw(cf_string_t *self,char *s,cf_size_t s_len)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = (ulong)(*(uint *)self >> 1);
  uVar3 = 0;
  while( true ) {
    if (((self->ptr[uVar3] != s[uVar3]) || (uVar2 == uVar3)) || (s_len == uVar3)) break;
    uVar3 = uVar3 + 1;
  }
  if (s_len == uVar3 && uVar2 == uVar3) {
    return 0;
  }
  if (uVar2 == uVar3 || s_len != uVar3) {
    if (s_len == uVar3 || uVar2 != uVar3) {
      return -(uint)((byte)self->ptr[uVar3] < (byte)s[uVar3]) | 1;
    }
    iVar1 = -1;
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int cf_string_cmp_raw(const cf_string_t* self, const char* s, cf_size_t s_len) {
    const char* ptr = self->ptr;
    cf_size_t len = self->len;
    for (; *ptr == *s && len > 0 && s_len > 0; ++ptr, ++s, --len, --s_len);
    if (len == 0 && s_len == 0) return 0;
    if (len > 0 && s_len == 0) return 1;
    if (s_len > 0 && len == 0) return -1;
    return (*CF_TYPE_CAST(cf_uchar_t*, ptr) < *CF_TYPE_CAST(cf_uchar_t*, s) ? -1 : 1);
}